

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O2

CURLcode ftp_pl_insert_finfo(connectdata *conn,curl_fileinfo *finfo)

{
  SessionHandle *pSVar1;
  curl_llist *list;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  code *pcVar8;
  CURLcode CVar9;
  
  pSVar1 = conn->data;
  list = (pSVar1->wildcard).filelist;
  plVar2 = (long *)(pSVar1->wildcard).tmp;
  lVar3 = *plVar2;
  pcVar4 = finfo->b_data;
  lVar5 = *(long *)(lVar3 + 0x28);
  finfo->filename = pcVar4 + lVar5;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x38);
  if (*(long *)(lVar3 + 0x38) == 0) {
    pcVar7 = (char *)0x0;
  }
  (finfo->strings).group = pcVar7;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x48);
  if (*(long *)(lVar3 + 0x48) == 0) {
    pcVar7 = (char *)0x0;
  }
  (finfo->strings).perm = pcVar7;
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x50);
  if (*(long *)(lVar3 + 0x50) == 0) {
    pcVar7 = (char *)0x0;
  }
  (finfo->strings).target = pcVar7;
  (finfo->strings).time = pcVar4 + *(long *)(lVar3 + 0x40);
  pcVar7 = pcVar4 + *(long *)(lVar3 + 0x30);
  if (*(long *)(lVar3 + 0x30) == 0) {
    pcVar7 = (char *)0x0;
  }
  (finfo->strings).user = pcVar7;
  pcVar8 = (pSVar1->set).fnmatch;
  if (pcVar8 == (curl_fnmatch_callback)0x0) {
    pcVar8 = Curl_fnmatch;
  }
  iVar6 = (*pcVar8)((pSVar1->set).fnmatch_data,(pSVar1->wildcard).pattern,pcVar4 + lVar5);
  CVar9 = CURLE_OK;
  if (iVar6 == 0) {
    if ((finfo->filetype == CURLFILETYPE_SYMLINK) &&
       (pcVar7 = (finfo->strings).target, pcVar7 != (char *)0x0)) {
      pcVar7 = strstr(pcVar7," -> ");
      if (pcVar7 != (char *)0x0) goto LAB_00467357;
    }
    iVar6 = Curl_llist_insert_next(list,list->tail,finfo);
    CVar9 = CURLE_OK;
    if (iVar6 != 0) goto LAB_00467361;
    CVar9 = CURLE_OUT_OF_MEMORY;
  }
LAB_00467357:
  Curl_fileinfo_dtor((void *)0x0,finfo);
LAB_00467361:
  *(undefined8 *)(*plVar2 + 0x10) = 0;
  return CVar9;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct curl_fileinfo *finfo)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc_tmpdata *tmpdata = wc->tmp;
  struct curl_llist *llist = wc->filelist;
  struct ftp_parselist_data *parser = tmpdata->parser;
  bool add = TRUE;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }

  if(add) {
    if(!Curl_llist_insert_next(llist, llist->tail, finfo)) {
      Curl_fileinfo_dtor(NULL, finfo);
      tmpdata->parser->file_data = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_fileinfo_dtor(NULL, finfo);
  }

  tmpdata->parser->file_data = NULL;
  return CURLE_OK;
}